

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O2

bool __thiscall FBehavior::Init(FBehavior *this,int lumpnum,FileReader *fr,int len)

{
  BYTE *pBVar1;
  byte bVar2;
  uint uVar3;
  SDWORD *pSVar4;
  ScriptFunction *pSVar5;
  ACSFormat AVar6;
  uint uVar7;
  int iVar8;
  DWORD DVar9;
  BYTE *pBVar10;
  ACSProfileInfo *pAVar11;
  ulong *puVar12;
  ArrayInfo *pAVar13;
  SDWORD *pSVar14;
  ArrayInfo **ppAVar15;
  char *pcVar16;
  uint uVar17;
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  DWORD i;
  uint uVar21;
  DWORD DVar22;
  ACSProfileInfo *pAVar23;
  FBehavior *pFVar24;
  uint uVar25;
  DWORD j_1;
  SDWORD **ppSVar26;
  DWORD *pDVar27;
  long lVar28;
  ulong uVar29;
  ScriptFunction *pSVar30;
  uint *puVar31;
  FBehavior *module;
  int local_5c;
  TArray<FBehavior_*,_FBehavior_*> *local_58;
  ulong local_50;
  char *local_48;
  BYTE *local_40;
  char *local_38;
  
  this->LumpNum = lumpnum;
  if (fr == (FileReader *)0x0) {
    len = FWadCollection::LumpLength(&Wads,lumpnum);
  }
  if (0x1f < len) {
    uVar20 = (ulong)(uint)len;
    pBVar10 = (BYTE *)operator_new__(uVar20);
    if (fr == (FileReader *)0x0) {
      FWadCollection::ReadLump(&Wads,lumpnum,pBVar10);
    }
    else {
      (*(fr->super_FileReaderBase)._vptr_FileReaderBase[2])(fr,pBVar10,uVar20);
    }
    if (((*pBVar10 == 'A') && (pBVar10[1] == 'C')) && (pBVar10[2] == 'S')) {
      bVar2 = pBVar10[3];
      AVar6 = (ACSFormat)bVar2;
      if (bVar2 == 0) {
LAB_00478eae:
        this->Format = AVar6;
        module = this;
        uVar7 = TArray<FBehavior_*,_FBehavior_*>::Push(&StaticModules,&module);
        local_48 = this->ModuleName;
        this->LibraryID = uVar7 << 0x14;
        if (fr == (FileReader *)0x0) {
          FWadCollection::GetLumpName(&Wads,local_48,lumpnum);
          this->ModuleName[8] = '\0';
        }
        else {
          builtin_strncpy(local_48,"BEHAVIOR",9);
        }
        this->Data = pBVar10;
        this->DataSize = len;
        uVar7 = *(uint *)(pBVar10 + 4);
        pBVar1 = pBVar10 + uVar7;
        if (this->Format == ACS_Old) {
          uVar21 = *(uint *)(pBVar1 + -4);
          this->Chunks = pBVar10 + uVar20;
          if ((0x17 < uVar7) && ((uVar21 | 0x20000000) == 0x65534341)) {
            this->Format = (uVar21 == 0x65534341) + ACS_Enhanced;
            this->Chunks = pBVar10 + *(uint *)(pBVar1 + -8);
            this->DataSize = uVar7 - 8;
          }
        }
        else {
          this->Chunks = pBVar1;
        }
        pFVar24 = this;
        LoadScriptsDirectory(this);
        if (this->Format == ACS_Old) {
          pBVar10 = this->Data;
          uVar7 = *(uint *)(pBVar10 + 4);
          this->StringTable = uVar7;
          uVar7 = uVar7 + *(int *)(pBVar10 + uVar7) * 0xc + 4;
          this->StringTable = uVar7;
          UnescapeStringTable(pFVar24,pBVar10 + uVar7,pBVar10,false);
        }
        else {
          UnencryptStrings(this);
          pFVar24 = this;
          pBVar10 = FindChunk(this,0x4c525453);
          if (pBVar10 == (BYTE *)0x0) {
            this->StringTable = 0;
          }
          else {
            this->StringTable = ((int)pBVar10 - *(int *)&this->Data) + 8;
            UnescapeStringTable(pFVar24,pBVar10 + 8,(BYTE *)0x0,true);
          }
        }
        if (this->Format == ACS_Old) {
          for (lVar19 = 0; lVar19 != 0x200; lVar19 = lVar19 + 4) {
            *(long *)((long)this->MapVars + lVar19 * 2) = (long)this->MapVarStore + lVar19;
          }
        }
        else {
          this->Functions = (ScriptFunction *)0x0;
          pBVar10 = FindChunk(this,0x434e5546);
          if (pBVar10 == (BYTE *)0x0) {
            uVar7 = this->NumFunctions;
          }
          else {
            uVar21 = *(uint *)(pBVar10 + 4);
            uVar7 = uVar21 >> 3;
            uVar20 = (ulong)uVar7;
            this->NumFunctions = uVar7;
            pAVar11 = (ACSProfileInfo *)operator_new__(uVar20 * 0x18);
            if (7 < uVar21) {
              pAVar23 = pAVar11;
              do {
                pAVar23->TotalInstr = 0;
                pAVar23->NumRuns = 0;
                pAVar23->MinInstrPerRun = 0xffffffff;
                pAVar23->MaxInstrPerRun = 0;
                pAVar23 = pAVar23 + 1;
              } while (pAVar23 != pAVar11 + uVar20);
            }
            this->FunctionProfileData = pAVar11;
            puVar12 = (ulong *)operator_new__(uVar20 * 0x20 + 8);
            *puVar12 = uVar20;
            if (7 < uVar21) {
              lVar19 = 0;
              do {
                *(undefined4 *)((long)puVar12 + lVar19 + 0x18) = 0;
                *(undefined8 *)((long)puVar12 + lVar19 + 0x20) = 0;
                lVar19 = lVar19 + 0x20;
              } while (uVar20 * 0x20 != lVar19);
            }
            this->Functions = (ScriptFunction *)(puVar12 + 1);
            for (uVar20 = 0; uVar7 * 8 != uVar20; uVar20 = uVar20 + 8) {
              (&((ScriptFunction *)(puVar12 + 1))->ArgCount)[uVar20 * 4] = pBVar10[uVar20 + 8];
              *(BYTE *)((long)puVar12 + uVar20 * 4 + 9) = pBVar10[uVar20 + 10];
              *(BYTE *)((long)puVar12 + uVar20 * 4 + 10) = pBVar10[uVar20 + 0xb];
              *(uint *)((long)puVar12 + uVar20 * 4 + 0xc) = (uint)pBVar10[uVar20 + 9];
              *(undefined4 *)((long)puVar12 + uVar20 * 4 + 0x10) =
                   *(undefined4 *)(pBVar10 + uVar20 + 0xc);
            }
          }
          if (0 < (int)uVar7) {
            for (pBVar10 = FindChunk(this,0x59524146); pBVar10 != (BYTE *)0x0;
                pBVar10 = NextChunk(this,pBVar10)) {
              if ((5 < *(int *)(pBVar10 + 4)) &&
                 ((uint)*(ushort *)(pBVar10 + 8) < (uint)this->NumFunctions)) {
                pSVar5 = this->Functions + *(ushort *)(pBVar10 + 8);
                iVar8 = ParseLocalArrayChunk
                                  (pBVar10,&pSVar5->LocalArrays,
                                   (uint)pSVar5->ArgCount + pSVar5->LocalCount);
                pSVar5->LocalCount = iVar8 - (uint)pSVar5->ArgCount;
              }
            }
          }
          pBVar10 = FindChunk(this,0x504d554a);
          if (pBVar10 != (BYTE *)0x0) {
            for (lVar19 = 0; lVar19 < *(int *)(pBVar10 + 4); lVar19 = lVar19 + 4) {
              module = (FBehavior *)CONCAT44(module._4_4_,*(undefined4 *)(pBVar10 + lVar19 + 8));
              TArray<int,_int>::Push(&this->JumpPoints,(int *)&module);
            }
          }
          pSVar4 = this->MapVarStore;
          memset(pSVar4,0,0x200);
          for (pBVar10 = FindChunk(this,0x494e494d); pBVar10 != (BYTE *)0x0;
              pBVar10 = NextChunk(this,pBVar10)) {
            uVar7 = *(uint *)(pBVar10 + 4);
            iVar8 = *(int *)(pBVar10 + 8);
            for (uVar20 = 0; ((uVar7 >> 2) - 1) + (uint)(uVar7 >> 2 == 0) != uVar20;
                uVar20 = uVar20 + 1) {
              pSVar4[(long)iVar8 + uVar20] = *(SDWORD *)(pBVar10 + uVar20 * 4 + 0xc);
            }
          }
          for (lVar19 = 0; lVar19 != 0x200; lVar19 = lVar19 + 4) {
            *(long *)((long)this->MapVars + lVar19 * 2) = (long)this->MapVarStore + lVar19;
          }
          pBVar10 = FindChunk(this,0x59415241);
          if (pBVar10 != (BYTE *)0x0) {
            uVar7 = *(uint *)(pBVar10 + 4);
            uVar21 = uVar7 >> 3;
            this->NumArrays = uVar21;
            pAVar13 = (ArrayInfo *)operator_new__((ulong)uVar21 << 4);
            this->ArrayStore = pAVar13;
            memset(pAVar13,0,(ulong)(uVar7 & 0xfffffff8));
            ppSVar26 = &pAVar13->Elements;
            for (uVar20 = 0; uVar20 < uVar21; uVar20 = uVar20 + 1) {
              pSVar4[*(uint *)(pBVar10 + uVar20 * 8 + 8)] = (SDWORD)uVar20;
              uVar7 = *(uint *)(pBVar10 + uVar20 * 8 + 0xc);
              ((ArrayInfo *)(ppSVar26 + -1))->ArraySize = uVar7;
              uVar29 = (ulong)uVar7 << 2;
              pSVar14 = (SDWORD *)operator_new__(uVar29);
              *ppSVar26 = pSVar14;
              memset(pSVar14,0,uVar29);
              ppSVar26 = ppSVar26 + 2;
            }
          }
          pBVar10 = FindChunk(this,0x494e4941);
          pAVar13 = this->ArrayStore;
          for (; pBVar10 != (BYTE *)0x0; pBVar10 = NextChunk(this,pBVar10)) {
            uVar7 = this->MapVarStore[*(uint *)(pBVar10 + 8)];
            if (uVar7 < (uint)this->NumArrays) {
              uVar21 = pAVar13[(int)uVar7].ArraySize;
              uVar17 = *(int *)(pBVar10 + 4) - 4U >> 2;
              if (uVar21 < uVar17) {
                uVar17 = uVar21;
              }
              pSVar14 = pAVar13[(int)uVar7].Elements;
              for (uVar20 = 0; uVar17 != uVar20; uVar20 = uVar20 + 1) {
                pSVar14[uVar20] = *(SDWORD *)(pBVar10 + uVar20 * 4 + 0xc);
              }
            }
          }
          uVar7 = this->NumArrays;
          this->NumTotalArrays = uVar7;
          pBVar10 = FindChunk(this,0x504d4941);
          uVar21 = uVar7;
          if (pBVar10 != (BYTE *)0x0) {
            uVar21 = *(int *)(pBVar10 + 8) + uVar7;
            this->NumTotalArrays = uVar21;
          }
          if (uVar21 != 0) {
            uVar20 = 0xffffffffffffffff;
            if (-1 < (int)uVar21) {
              uVar20 = (long)(int)uVar21 << 3;
            }
            ppAVar15 = (ArrayInfo **)operator_new__(uVar20);
            this->Arrays = ppAVar15;
            uVar29 = 0;
            uVar20 = (ulong)uVar7;
            if ((int)uVar7 < 1) {
              uVar20 = uVar29;
            }
            for (uVar18 = 0; uVar20 != uVar18; uVar18 = uVar18 + 1) {
              this->Arrays[uVar18] = (ArrayInfo *)((long)&this->ArrayStore->ArraySize + uVar29);
              uVar29 = uVar29 + 0x10;
            }
          }
          if (this->LibraryID != 0) {
            pBVar10 = FindChunk(this,0x5254534d);
            if (pBVar10 != (BYTE *)0x0) {
              for (uVar20 = 0; uVar20 < *(uint *)(pBVar10 + 4) >> 2; uVar20 = uVar20 + 1) {
                pcVar16 = LookupString(this,this->MapVarStore[*(uint *)(pBVar10 + uVar20 * 4 + 8)]);
                if (pcVar16 != (char *)0x0) {
                  iVar8 = ACSStringPool::AddString(&GlobalACSStrings,pcVar16);
                  pSVar4[*(uint *)(pBVar10 + uVar20 * 4 + 8)] = iVar8;
                }
              }
            }
            pBVar10 = FindChunk(this,0x52545341);
            if (pBVar10 != (BYTE *)0x0) {
              for (uVar20 = 0; uVar20 < *(uint *)(pBVar10 + 4) >> 2; uVar20 = uVar20 + 1) {
                uVar7 = this->MapVarStore[*(uint *)(pBVar10 + uVar20 * 4 + 8)];
                if (uVar7 < (uint)this->NumArrays) {
                  pDVar27 = (DWORD *)this->ArrayStore[(int)uVar7].Elements;
                  for (DVar22 = this->ArrayStore[(int)uVar7].ArraySize; 0 < (int)DVar22;
                      DVar22 = DVar22 - 1) {
                    pcVar16 = LookupString(this,*pDVar27);
                    if (pcVar16 != (char *)0x0) {
                      DVar9 = ACSStringPool::AddString(&GlobalACSStrings,pcVar16);
                      *pDVar27 = DVar9;
                    }
                    pDVar27 = pDVar27 + 1;
                  }
                }
              }
            }
            for (pBVar10 = FindChunk(this,0x47415441); pBVar10 != (BYTE *)0x0;
                pBVar10 = NextChunk(this,pBVar10)) {
              if ((pBVar10[8] == '\0') &&
                 (uVar7 = this->MapVarStore[*(int *)(pBVar10 + 9)], uVar7 < (uint)this->NumArrays))
              {
                pSVar4 = this->ArrayStore[(int)uVar7].Elements;
                uVar7 = this->ArrayStore[(int)uVar7].ArraySize;
                uVar21 = *(int *)(pBVar10 + 4) - 5U;
                if (uVar7 <= *(int *)(pBVar10 + 4) - 5U) {
                  uVar21 = uVar7;
                }
                lVar19 = 0;
                for (; 0 < (int)uVar21; uVar21 = uVar21 - 1) {
                  if (pBVar10[lVar19 + 0xd] == '\x01') {
                    pcVar16 = LookupString(this,pSVar4[lVar19]);
                    if (pcVar16 != (char *)0x0) {
                      uVar7 = ACSStringPool::AddString(&GlobalACSStrings,pcVar16);
                      goto LAB_004795b3;
                    }
                  }
                  else if (pBVar10[lVar19 + 0xd] == '\x02') {
                    uVar7 = pSVar4[lVar19] | this->LibraryID;
LAB_004795b3:
                    pSVar4[lVar19] = uVar7;
                  }
                  lVar19 = lVar19 + 1;
                }
              }
            }
          }
          pBVar10 = FindChunk(this,0x44414f4c);
          if (pBVar10 != (BYTE *)0x0) {
            local_58 = &this->Imports;
            uVar20 = 0;
            while (uVar7 = (uint)uVar20, uVar7 < *(uint *)(pBVar10 + 4)) {
              if (pBVar10[uVar20 + 8] != '\0') {
                module = (FBehavior *)0x0;
                iVar8 = FWadCollection::CheckNumForName(&Wads,(char *)(pBVar10 + uVar20 + 8),4);
                if (iVar8 < 0) {
                  Printf("\x1cGCould not find ACS library %s.\n",pBVar10 + uVar20 + 8);
                }
                else {
                  module = StaticLoadModule(iVar8,(FileReader *)0x0,0);
                }
                if (module != (FBehavior *)0x0) {
                  TArray<FBehavior_*,_FBehavior_*>::Push(local_58,&module);
                }
                do {
                  uVar7 = (int)uVar20 + 1;
                  uVar20 = (ulong)uVar7;
                } while (pBVar10[uVar20 + 8] != '\0');
              }
              uVar20 = (ulong)(uVar7 + 1);
            }
            uVar20 = 0;
            while (uVar20 < (this->Imports).Count) {
              pFVar24 = local_58->Array[uVar20];
              local_50 = uVar20;
              if (pFVar24 != (FBehavior *)0x0) {
                pBVar10 = FindChunk(this,0x4d414e46);
                local_5c = (int)local_50 + 1;
                local_38 = pFVar24->ModuleName;
                lVar19 = 8;
                local_40 = pBVar10;
                for (lVar28 = 0; lVar28 < this->NumFunctions; lVar28 = lVar28 + 1) {
                  pSVar5 = this->Functions;
                  if (((*(int *)(&pSVar5->ArgCount + lVar19) == 0) &&
                      (*(char *)((long)pSVar5 + lVar19 + -6) == '\0')) &&
                     (uVar7 = FindFunctionName(pFVar24,(char *)(pBVar10 +
                                                               (ulong)*(uint *)(local_40 +
                                                                               lVar28 * 4 + 0xc) + 8
                                                               )), -1 < (int)uVar7)) {
                    if ((pFVar24->Functions[uVar7].Address != 0) &&
                       (pSVar30 = pFVar24->Functions + uVar7, pSVar30->ImportNum == '\0')) {
                      *(uint *)(&pSVar5->ArgCount + lVar19) = uVar7;
                      *(char *)((long)pSVar5 + lVar19 + -6) = (char)local_5c;
                      if (pSVar30->ArgCount != *(byte *)((long)pSVar5 + lVar19 + -8)) {
                        Printf("\x1cIFunction %s in %s has %d arguments. %s expects it to have %d.\n"
                               ,pBVar10 + (ulong)*(uint *)(local_40 + lVar28 * 4 + 0xc) + 8,local_38
                               ,(ulong)pSVar30->ArgCount,local_48);
                        this->Format = ACS_Unknown;
                      }
                      *(int *)((long)pSVar5 + lVar19 + -4) = pSVar30->LocalCount;
                      *(BYTE *)((long)pSVar5 + lVar19 + -7) = pSVar30->HasReturnValue;
                    }
                  }
                  lVar19 = lVar19 + 0x20;
                }
                pBVar10 = FindChunk(this,0x504d494d);
                if (pBVar10 != (BYTE *)0x0) {
                  uVar7 = *(uint *)(pBVar10 + 4);
                  uVar20 = 0;
                  while (uVar21 = (uint)uVar20, uVar21 < uVar7) {
                    uVar17 = FindMapVarName(pFVar24,(char *)(pBVar10 + (ulong)(uVar21 + 4) + 8));
                    if (-1 < (int)uVar17) {
                      this->MapVars[*(uint *)(pBVar10 + uVar20 + 8)] = pFVar24->MapVarStore + uVar17
                      ;
                    }
                    uVar29 = (ulong)(uVar21 + 5);
                    do {
                      uVar20 = (ulong)((int)uVar29 + 1);
                      lVar19 = uVar29 + 8;
                      uVar29 = uVar20;
                    } while (pBVar10[lVar19] != '\0');
                  }
                }
                if (this->NumArrays < this->NumTotalArrays) {
                  pBVar10 = FindChunk(this,0x504d4941);
                  puVar31 = (uint *)(pBVar10 + 0xc);
                  for (uVar7 = 0; uVar7 < *(uint *)(pBVar10 + 8); uVar7 = uVar7 + 1) {
                    uVar21 = puVar31[1];
                    uVar17 = FindMapArray(pFVar24,(char *)(puVar31 + 2));
                    if (-1 < (int)uVar17) {
                      uVar3 = *puVar31;
                      uVar25 = this->NumArrays + uVar7;
                      this->Arrays[uVar25] = pFVar24->ArrayStore + uVar17;
                      this->MapVarStore[uVar3] = uVar25;
                      uVar17 = pFVar24->ArrayStore[uVar17].ArraySize;
                      if (uVar17 != uVar21) {
                        this->Format = ACS_Unknown;
                        Printf("\x1cIThe array %s in %s has %u elements, but %s expects it to only have %u.\n"
                               ,puVar31 + 2,local_38,(ulong)uVar17,local_48,(ulong)uVar21);
                      }
                    }
                    puVar31 = (uint *)((long)puVar31 + 9);
                    do {
                      uVar21 = *puVar31;
                      puVar31 = (uint *)((long)puVar31 + 1);
                    } while ((char)uVar21 != '\0');
                  }
                }
              }
              uVar20 = local_50 + 1;
            }
          }
        }
        DPrintf(3,"Loaded %d scripts, %d functions\n",(ulong)(uint)this->NumScripts,
                (ulong)(uint)this->NumFunctions);
        return true;
      }
      if (bVar2 == 0x65) {
        AVar6 = ACS_LittleEnhanced;
        goto LAB_00478eae;
      }
      if (bVar2 == 0x45) {
        AVar6 = ACS_Enhanced;
        goto LAB_00478eae;
      }
    }
    operator_delete__(pBVar10);
  }
  return false;
}

Assistant:

bool FBehavior::Init(int lumpnum, FileReader * fr, int len)
{
	BYTE *object;
	int i;

	LumpNum = lumpnum;

	// Now that everything is set up, record this module as being among the loaded modules.
	// We need to do this before resolving any imports, because an import might (indirectly)
	// need to resolve exports in this module. The only things that can be exported are
	// functions and map variables, which must already be present if they're exported, so
	// this is okay.

	// This must be done first for 2 reasons:
	// 1. If not, corrupt modules cause memory leaks
	// 2. Corrupt modules won't be reported when a level is being loaded if this function quits before
	//    adding it to the list.

	if (fr == NULL) len = Wads.LumpLength (lumpnum);



	// Any behaviors smaller than 32 bytes cannot possibly contain anything useful.
	// (16 bytes for a completely empty behavior + 12 bytes for one script header
	//  + 4 bytes for PCD_TERMINATE for an old-style object. A new-style object
	// has 24 bytes if it is completely empty. An empty SPTR chunk adds 8 bytes.)
	if (len < 32)
	{
		return false;
	}

	object = new BYTE[len];
	if (fr == NULL)
	{
		Wads.ReadLump (lumpnum, object);
	}
	else
	{
		fr->Read (object, len);
	}

	if (object[0] != 'A' || object[1] != 'C' || object[2] != 'S')
	{
		delete[] object;
		return false;
	}

	switch (object[3])
	{
	case 0:
		Format = ACS_Old;
		break;
	case 'E':
		Format = ACS_Enhanced;
		break;
	case 'e':
		Format = ACS_LittleEnhanced;
		break;
	default:
		delete[] object;
		return false;
	}
    LibraryID = StaticModules.Push (this) << LIBRARYID_SHIFT;

	if (fr == NULL)
	{
		Wads.GetLumpName (ModuleName, lumpnum);
		ModuleName[8] = 0;
	}
	else
	{
		strcpy(ModuleName, "BEHAVIOR");
	}

	Data = object;
	DataSize = len;

	if (Format == ACS_Old)
	{
		DWORD dirofs = LittleLong(((DWORD *)object)[1]);
		DWORD pretag = ((DWORD *)(object + dirofs))[-1];

		Chunks = object + len;
		// Check for redesigned ACSE/ACSe
		if (dirofs >= 6*4 &&
			(pretag == MAKE_ID('A','C','S','e') ||
			 pretag == MAKE_ID('A','C','S','E')))
		{
			Format = (pretag == MAKE_ID('A','C','S','e')) ? ACS_LittleEnhanced : ACS_Enhanced;
			Chunks = object + LittleLong(((DWORD *)(object + dirofs))[-2]);
			// Forget about the compatibility cruft at the end of the lump
			DataSize = LittleLong(((DWORD *)object)[1]) - 8;
		}
	}
	else
	{
		Chunks = object + LittleLong(((DWORD *)object)[1]);
	}

	LoadScriptsDirectory ();

	if (Format == ACS_Old)
	{
		StringTable = LittleLong(((DWORD *)Data)[1]);
		StringTable += LittleLong(((DWORD *)(Data + StringTable))[0]) * 12 + 4;
		UnescapeStringTable(Data + StringTable, Data, false);
	}
	else
	{
		UnencryptStrings ();
		BYTE *strings = FindChunk (MAKE_ID('S','T','R','L'));
		if (strings != NULL)
		{
			StringTable = DWORD(strings - Data + 8);
			UnescapeStringTable(strings + 8, NULL, true);
		}
		else
		{
			StringTable = 0;
		}
	}

	if (Format == ACS_Old)
	{
		// Do initialization for old-style behavior lumps
		for (i = 0; i < NUM_MAPVARS; ++i)
		{
			MapVars[i] = &MapVarStore[i];
		}
		//LibraryID = StaticModules.Push (this) << LIBRARYID_SHIFT;
	}
	else
	{
		DWORD *chunk;

		// Load functions
		BYTE *funcs;
		Functions = NULL;
		funcs = FindChunk (MAKE_ID('F','U','N','C'));
		if (funcs != NULL)
		{
			NumFunctions = LittleLong(((DWORD *)funcs)[1]) / 8;
			funcs += 8;
			FunctionProfileData = new ACSProfileInfo[NumFunctions];
			Functions = new ScriptFunction[NumFunctions];
			for (i = 0; i < NumFunctions; ++i)
			{
				ScriptFunctionInFile *funcf = &((ScriptFunctionInFile *)funcs)[i];
				ScriptFunction *funcm = &Functions[i];
				funcm->ArgCount = funcf->ArgCount;
				funcm->HasReturnValue = funcf->HasReturnValue;
				funcm->ImportNum = funcf->ImportNum;
				funcm->LocalCount = funcf->LocalCount;
				funcm->Address = LittleLong(funcf->Address);
			}
		}

		// Load local arrays for functions
		if (NumFunctions > 0)
		{
			for (chunk = (DWORD *)FindChunk(MAKE_ID('F','A','R','Y')); chunk != NULL; chunk = (DWORD *)NextChunk((BYTE *)chunk))
			{
				int size = LittleLong(chunk[1]);
				if (size >= 6)
				{
					unsigned int func_num = LittleShort(((WORD *)chunk)[4]);
					if (func_num < (unsigned int)NumFunctions)
					{
						ScriptFunction *func = &Functions[func_num];
						// Unlike scripts, functions do not include their arg count in their local count.
						func->LocalCount = ParseLocalArrayChunk(chunk, &func->LocalArrays, func->LocalCount + func->ArgCount) - func->ArgCount;
					}
				}
			}
		}

		// Load JUMP points
		chunk = (DWORD *)FindChunk (MAKE_ID('J','U','M','P'));
		if (chunk != NULL)
		{
			for (i = 0;i < (int)LittleLong(chunk[1]);i += 4)
				JumpPoints.Push(LittleLong(chunk[2 + i/4]));
		}

		// Initialize this object's map variables
		memset (MapVarStore, 0, sizeof(MapVarStore));
		chunk = (DWORD *)FindChunk (MAKE_ID('M','I','N','I'));
		while (chunk != NULL)
		{
			int numvars = LittleLong(chunk[1])/4 - 1;
			int firstvar = LittleLong(chunk[2]);
			for (i = 0; i < numvars; ++i)
			{
				MapVarStore[i+firstvar] = LittleLong(chunk[3+i]);
			}
			chunk = (DWORD *)NextChunk ((BYTE *)chunk);
		}

		// Initialize this object's map variable pointers to defaults. They can be changed
		// later once the imported modules are loaded.
		for (i = 0; i < NUM_MAPVARS; ++i)
		{
			MapVars[i] = &MapVarStore[i];
		}

		// Create arrays for this module
		chunk = (DWORD *)FindChunk (MAKE_ID('A','R','A','Y'));
		if (chunk != NULL)
		{
			NumArrays = LittleLong(chunk[1])/8;
			ArrayStore = new ArrayInfo[NumArrays];
			memset (ArrayStore, 0, sizeof(*Arrays)*NumArrays);
			for (i = 0; i < NumArrays; ++i)
			{
				MapVarStore[LittleLong(chunk[2+i*2])] = i;
				ArrayStore[i].ArraySize = LittleLong(chunk[3+i*2]);
				ArrayStore[i].Elements = new SDWORD[ArrayStore[i].ArraySize];
				memset(ArrayStore[i].Elements, 0, ArrayStore[i].ArraySize*sizeof(DWORD));
			}
		}

		// Initialize arrays for this module
		chunk = (DWORD *)FindChunk (MAKE_ID('A','I','N','I'));
		while (chunk != NULL)
		{
			int arraynum = MapVarStore[LittleLong(chunk[2])];
			if ((unsigned)arraynum < (unsigned)NumArrays)
			{
				// Use unsigned iterator here to avoid issue with GCC 4.9/5.x
				// optimizer. Might be some undefined behavior in this code,
				// but I don't know what it is.
				unsigned int initsize = MIN<unsigned int> (ArrayStore[arraynum].ArraySize, (LittleLong(chunk[1])-4)/4);
				SDWORD *elems = ArrayStore[arraynum].Elements;
				for (unsigned int j = 0; j < initsize; ++j)
				{
					elems[j] = LittleLong(chunk[3+j]);
				}
			}
			chunk = (DWORD *)NextChunk((BYTE *)chunk);
		}

		// Start setting up array pointers
		NumTotalArrays = NumArrays;
		chunk = (DWORD *)FindChunk (MAKE_ID('A','I','M','P'));
		if (chunk != NULL)
		{
			NumTotalArrays += LittleLong(chunk[2]);
		}
		if (NumTotalArrays != 0)
		{
			Arrays = new ArrayInfo *[NumTotalArrays];
			for (i = 0; i < NumArrays; ++i)
			{
				Arrays[i] = &ArrayStore[i];
			}
		}

		// Tag the library ID to any map variables that are initialized with strings
		if (LibraryID != 0)
		{
			chunk = (DWORD *)FindChunk (MAKE_ID('M','S','T','R'));
			if (chunk != NULL)
			{
				for (DWORD i = 0; i < LittleLong(chunk[1])/4; ++i)
				{
					const char *str = LookupString(MapVarStore[LittleLong(chunk[i+2])]);
					if (str != NULL)
					{
						MapVarStore[LittleLong(chunk[i+2])] = GlobalACSStrings.AddString(str);
					}
				}
			}

			chunk = (DWORD *)FindChunk (MAKE_ID('A','S','T','R'));
			if (chunk != NULL)
			{
				for (DWORD i = 0; i < LittleLong(chunk[1])/4; ++i)
				{
					int arraynum = MapVarStore[LittleLong(chunk[i+2])];
					if ((unsigned)arraynum < (unsigned)NumArrays)
					{
						SDWORD *elems = ArrayStore[arraynum].Elements;
						for (int j = ArrayStore[arraynum].ArraySize; j > 0; --j, ++elems)
						{
//							*elems |= LibraryID;
							const char *str = LookupString(*elems);
							if (str != NULL)
							{
								*elems = GlobalACSStrings.AddString(str);
							}
						}
					}
				}
			}

			// [BL] Newer version of ASTR for structure aware compilers although we only have one array per chunk
			chunk = (DWORD *)FindChunk (MAKE_ID('A','T','A','G'));
			while (chunk != NULL)
			{
				const BYTE* chunkData = (const BYTE*)(chunk + 2);
				// First byte is version, it should be 0
				if(*chunkData++ == 0)
				{
					int arraynum = MapVarStore[uallong(LittleLong(*(const int*)(chunkData)))];
					chunkData += 4;
					if ((unsigned)arraynum < (unsigned)NumArrays)
					{
						SDWORD *elems = ArrayStore[arraynum].Elements;
						// Ending zeros may be left out.
						for (int j = MIN(LittleLong(chunk[1])-5, ArrayStore[arraynum].ArraySize); j > 0; --j, ++elems, ++chunkData)
						{
							// For ATAG, a value of 0 = Integer, 1 = String, 2 = FunctionPtr
							// Our implementation uses the same tags for both String and FunctionPtr
							if (*chunkData == 2)
							{
								*elems |= LibraryID;
							}
							else if (*chunkData == 1)
							{
								const char *str = LookupString(*elems);
								if (str != NULL)
								{
									*elems = GlobalACSStrings.AddString(str);
								}
							}
						}
					}
				}

				chunk = (DWORD *)NextChunk ((BYTE *)chunk);
			}
		}

		// Load required libraries.
		if (NULL != (chunk = (DWORD *)FindChunk (MAKE_ID('L','O','A','D'))))
		{
			const char *const parse = (char *)&chunk[2];
			DWORD i;

			for (i = 0; i < LittleLong(chunk[1]); )
			{
				if (parse[i])
				{
					FBehavior *module = NULL;
					int lump = Wads.CheckNumForName (&parse[i], ns_acslibrary);
					if (lump < 0)
					{
						Printf (TEXTCOLOR_RED "Could not find ACS library %s.\n", &parse[i]);
					}
					else
					{
						module = StaticLoadModule (lump);
					}
					if (module != NULL) Imports.Push (module);
					do {;} while (parse[++i]);
				}
				++i;
			}

			// Go through each imported module in order and resolve all imported functions
			// and map variables.
			for (i = 0; i < Imports.Size(); ++i)
			{
				FBehavior *lib = Imports[i];
				int j;

				if (lib == NULL)
					continue;

				// Resolve functions
				chunk = (DWORD *)FindChunk(MAKE_ID('F','N','A','M'));
				for (j = 0; j < NumFunctions; ++j)
				{
					ScriptFunction *func = &((ScriptFunction *)Functions)[j];
					if (func->Address == 0 && func->ImportNum == 0)
					{
						int libfunc = lib->FindFunctionName ((char *)(chunk + 2) + LittleLong(chunk[3+j]));
						if (libfunc >= 0)
						{
							ScriptFunction *realfunc = &((ScriptFunction *)lib->Functions)[libfunc];
							// Make sure that the library really defines this function. It might simply
							// be importing it itself.
							if (realfunc->Address != 0 && realfunc->ImportNum == 0)
							{
								func->Address = libfunc;
								func->ImportNum = i+1;
								if (realfunc->ArgCount != func->ArgCount)
								{
									Printf (TEXTCOLOR_ORANGE "Function %s in %s has %d arguments. %s expects it to have %d.\n",
										(char *)(chunk + 2) + LittleLong(chunk[3+j]), lib->ModuleName, realfunc->ArgCount,
										ModuleName, func->ArgCount);
									Format = ACS_Unknown;
								}
								// The next two properties do not affect code compatibility, so it is
								// okay for them to be different in the imported module than they are
								// in this one, as long as we make sure to use the real values.
								func->LocalCount = LittleLong(realfunc->LocalCount);
								func->HasReturnValue = realfunc->HasReturnValue;
							}
						}
					}
				}

				// Resolve map variables
				chunk = (DWORD *)FindChunk(MAKE_ID('M','I','M','P'));
				if (chunk != NULL)
				{
					char *parse = (char *)&chunk[2];
					for (DWORD j = 0; j < LittleLong(chunk[1]); )
					{
						DWORD varNum = LittleLong(*(DWORD *)&parse[j]);
						j += 4;
						int impNum = lib->FindMapVarName (&parse[j]);
						if (impNum >= 0)
						{
							MapVars[varNum] = &lib->MapVarStore[impNum];
						}
						do {;} while (parse[++j]);
						++j;
					}
				}

				// Resolve arrays
				if (NumTotalArrays > NumArrays)
				{
					chunk = (DWORD *)FindChunk(MAKE_ID('A','I','M','P'));
					char *parse = (char *)&chunk[3];
					for (DWORD j = 0; j < LittleLong(chunk[2]); ++j)
					{
						DWORD varNum = LittleLong(*(DWORD *)parse);
						parse += 4;
						DWORD expectedSize = LittleLong(*(DWORD *)parse);
						parse += 4;
						int impNum = lib->FindMapArray (parse);
						if (impNum >= 0)
						{
							Arrays[NumArrays + j] = &lib->ArrayStore[impNum];
							MapVarStore[varNum] = NumArrays + j;
							if (lib->ArrayStore[impNum].ArraySize != expectedSize)
							{
								Format = ACS_Unknown;
								Printf (TEXTCOLOR_ORANGE "The array %s in %s has %u elements, but %s expects it to only have %u.\n",
									parse, lib->ModuleName, lib->ArrayStore[impNum].ArraySize,
									ModuleName, expectedSize);
							}
						}
						do {;} while (*++parse);
						++parse;
					}
				}
			}
		}
	}

	DPrintf (DMSG_NOTIFY, "Loaded %d scripts, %d functions\n", NumScripts, NumFunctions);
	return true;
}